

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_parse_tagged(int argc,char **argv,arg_hdr **table,arg_end *endtable)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  longoptions *__ptr;
  char *options;
  int errorcode_1;
  void *parent_1;
  int tabindex_1;
  int errorcode;
  void *parent;
  int tabindex;
  int copt;
  char *shortoptions;
  longoptions *longoptions;
  arg_end *endtable_local;
  arg_hdr **table_local;
  char **argv_local;
  int argc_local;
  
  __ptr = alloc_longoptions(table);
  options = alloc_shortoptions(table);
  if ((__ptr == (longoptions *)0x0) || (options == (char *)0x0)) {
    arg_register_error(endtable,endtable,2,(char *)0x0);
    free(options);
    free(__ptr);
  }
  else {
    optind = 0;
    opterr = 0;
    while (iVar2 = getopt_long(argc,argv,options,__ptr->options,(int *)0x0), iVar2 != -1) {
      if (iVar2 == 0) {
        iVar2 = __ptr->getoptval;
        pvVar1 = table[iVar2]->parent;
        if (((optarg != (char *)0x0) && (*optarg == '\0')) && ((table[iVar2]->flag & 2U) != 0)) {
          arg_register_error(endtable,endtable,5,argv[optind + -1]);
        }
        if ((table[iVar2]->scanfn != (arg_scanfn *)0x0) &&
           (iVar2 = (*table[iVar2]->scanfn)(pvVar1,optarg), iVar2 != 0)) {
          arg_register_error(endtable,pvVar1,iVar2,optarg);
        }
      }
      else if (iVar2 == 0x3a) {
        arg_register_error(endtable,endtable,5,argv[optind + -1]);
      }
      else if (iVar2 == 0x3f) {
        if (optopt == 0) {
          arg_register_error(endtable,endtable,4,argv[optind + -1]);
        }
        else {
          arg_register_error(endtable,endtable,optopt,(char *)0x0);
        }
      }
      else {
        iVar3 = find_shortoption(table,(char)iVar2);
        if (iVar3 == -1) {
          arg_register_error(endtable,endtable,iVar2,(char *)0x0);
        }
        else if (table[iVar3]->scanfn != (arg_scanfn *)0x0) {
          pvVar1 = table[iVar3]->parent;
          iVar2 = (*table[iVar3]->scanfn)(pvVar1,optarg);
          if (iVar2 != 0) {
            arg_register_error(endtable,pvVar1,iVar2,optarg);
          }
        }
      }
    }
    free(options);
    free(__ptr);
  }
  return;
}

Assistant:

static
void arg_parse_tagged(int argc,
					  char * *argv,
					  struct arg_hdr * *table,
					  struct arg_end * endtable) {
	struct longoptions * longoptions;
	char * shortoptions;
	int copt;

	/*printf("arg_parse_tagged(%d,%p,%p,%p)\n",argc,argv,table,endtable);*/

	/* allocate short and long option arrays for the given opttable[].   */
	/* if the allocs fail then put an error msg in the last table entry. */
	longoptions  = alloc_longoptions(table);
	shortoptions = alloc_shortoptions(table);

	if (!longoptions || !shortoptions) {
		/* one or both memory allocs failed */
		arg_register_error(endtable, endtable, ARG_EMALLOC, NULL);
		/* free anything that was allocated (this is null safe) */
		free(shortoptions);
		free(longoptions);
		return;
	}

	/*dump_longoptions(longoptions);*/

	/* reset getopts internal option-index to zero, and disable error reporting */
	optind = 0;
	opterr = 0;

	/* fetch and process args using getopt_long */
	while ( (copt =
				 getopt_long(argc, argv, shortoptions, longoptions->options,
							 NULL)) != -1) {
		/*
		   printf("optarg='%s'\n",optarg);
		   printf("optind=%d\n",optind);
		   printf("copt=%c\n",(char)copt);
		   printf("optopt=%c (%d)\n",optopt, (int)(optopt));
		 */
		switch (copt) {
			case 0: {
				int tabindex = longoptions->getoptval;
				void * parent  = table[tabindex]->parent;

				/*printf("long option detected from argtable[%d]\n", tabindex);*/
				if (optarg && optarg[0] == 0 &&
						(table[tabindex]->flag & ARG_HASVALUE)) {
					/* printf(": long option %s requires an argument\n",argv[optind-1]); */
					arg_register_error(endtable, endtable, ARG_EMISSARG,
									   argv[optind - 1]);
					/* continue to scan the (empty) argument value to enforce argument count checking */
				}

				if (table[tabindex]->scanfn) {
					int errorcode = table[tabindex]->scanfn(parent, optarg);

					if (errorcode != 0) {
						arg_register_error(endtable, parent, errorcode, optarg);
					}
				}
			}
			break;

			case '?':

				/*
				 * getopt_long() found an unrecognised short option.
				 * if it was a short option its value is in optopt
				 * if it was a long option then optopt=0
				 */
				switch (optopt) {
					case 0:
						/*printf("?0 unrecognised long option %s\n",argv[optind-1]);*/
						arg_register_error(endtable, endtable, ARG_ELONGOPT,
										   argv[optind - 1]);
						break;

					default:
						/*printf("?* unrecognised short option '%c'\n",optopt);*/
						arg_register_error(endtable, endtable, optopt, NULL);
						break;
				}

				break;

			case ':':
				/*
				 * getopt_long() found an option with its argument missing.
				 */
				/*printf(": option %s requires an argument\n",argv[optind-1]); */
				arg_register_error(endtable, endtable, ARG_EMISSARG,
								   argv[optind - 1]);
				break;

			default: {
				/* getopt_long() found a valid short option */
				int tabindex = find_shortoption(table, (char)copt);

				/*printf("short option detected from argtable[%d]\n", tabindex);*/
				if (tabindex == -1) {
					/* should never get here - but handle it just in case */
					/*printf("unrecognised short option %d\n",copt);*/
					arg_register_error(endtable, endtable, copt, NULL);
				} else {
					if (table[tabindex]->scanfn) {
						void * parent  = table[tabindex]->parent;
						int errorcode = table[tabindex]->scanfn(parent, optarg);

						if (errorcode != 0) {
							arg_register_error(endtable, parent, errorcode, optarg);
						}
					}
				}

				break;
			}
		}
	}

	free(shortoptions);
	free(longoptions);
}